

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O2

void __thiscall
compiler::EmissionContext::EmissionContext
          (EmissionContext *this,shared_ptr<compiler::EmissionContext> *outerContext)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->byteCode).super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->byteCode).super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scopeStartIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scopeStartIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->firstFreeVariablesIndex = 0;
  (this->scopeStartIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->closures).
  super__Vector_base<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->closures).
  super__Vector_base<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->variables).
  super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->closures).
  super__Vector_base<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->variables).
  super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->variables).
  super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->byteCode).super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->outerContext).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (outerContext->super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  (this->outerContext).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (outerContext->super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>)
           ._M_refcount._M_pi;
  (outerContext->super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->outerContext).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  (outerContext->super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (this->loopConditionEvalJumpIndices).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->loopConditionEvalJumpIndices).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->loopStartIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->loopConditionEvalJumpIndices).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->loopStartIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->loopStartIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->breakStatementsForLoops)._M_h._M_buckets =
       &(this->breakStatementsForLoops)._M_h._M_single_bucket;
  (this->breakStatementsForLoops)._M_h._M_bucket_count = 1;
  (this->breakStatementsForLoops)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->breakStatementsForLoops)._M_h._M_element_count = 0;
  (this->breakStatementsForLoops)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->breakStatementsForLoops)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->breakStatementsForLoops)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->ifConditionEvalJumpIndices).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->ifConditionEvalJumpIndices).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->ifConditionEvalJumpIndices).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->elseStatementStartIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->elseStatementStartIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->elseStatementStartIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

explicit EmissionContext(
    std::shared_ptr<EmissionContext> outerContext
  ) noexcept
  : outerContext{std::move(outerContext)}
  {}